

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 454.test.cpp
# Opt level: O2

void verifyChunk(Type<8,_454> *chunk)

{
  vector<double,_std::allocator<double>_> *this;
  int iVar1;
  size_type sVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  range_reference_t<D<true>_>_conflict2 pdVar5;
  long lVar6;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef macroName_46;
  StringRef macroName_47;
  StringRef macroName_48;
  StringRef macroName_49;
  StringRef macroName_50;
  StringRef macroName_51;
  StringRef macroName_52;
  StringRef macroName_53;
  StringRef macroName_54;
  StringRef macroName_55;
  StringRef macroName_56;
  StringRef macroName_57;
  StringRef macroName_58;
  StringRef macroName_59;
  StringRef macroName_60;
  StringRef macroName_61;
  StringRef macroName_62;
  StringRef macroName_63;
  StringRef macroName_64;
  StringRef macroName_65;
  StringRef macroName_66;
  StringRef macroName_67;
  StringRef macroName_68;
  StringRef macroName_69;
  StringRef macroName_70;
  StringRef macroName_71;
  StringRef macroName_72;
  StringRef macroName_73;
  StringRef macroName_74;
  StringRef macroName_75;
  StringRef macroName_76;
  StringRef macroName_77;
  StringRef macroName_78;
  StringRef macroName_79;
  StringRef macroName_80;
  StringRef macroName_81;
  StringRef macroName_82;
  StringRef macroName_83;
  StringRef macroName_84;
  StringRef macroName_85;
  StringRef macroName_86;
  StringRef macroName_87;
  StringRef macroName_88;
  StringRef macroName_89;
  StringRef macroName_90;
  StringRef macroName_91;
  StringRef macroName_92;
  StringRef macroName_93;
  StringRef macroName_94;
  StringRef macroName_95;
  StringRef macroName_96;
  StringRef macroName_97;
  StringRef macroName_98;
  StringRef macroName_99;
  StringRef macroName_x00100;
  StringRef macroName_x00101;
  StringRef macroName_x00102;
  StringRef macroName_x00103;
  StringRef macroName_x00104;
  StringRef macroName_x00105;
  StringRef macroName_x00106;
  StringRef macroName_x00107;
  StringRef macroName_x00108;
  StringRef macroName_x00109;
  StringRef macroName_x00110;
  StringRef macroName_x00111;
  StringRef macroName_x00112;
  StringRef macroName_x00113;
  StringRef macroName_x00114;
  StringRef macroName_x00115;
  StringRef macroName_x00116;
  StringRef macroName_x00117;
  StringRef macroName_x00118;
  StringRef macroName_x00119;
  StringRef macroName_x00120;
  StringRef macroName_x00121;
  StringRef macroName_x00122;
  StringRef macroName_x00123;
  StringRef macroName_x00124;
  StringRef macroName_x00125;
  StringRef macroName_x00126;
  StringRef macroName_x00127;
  StringRef macroName_x00128;
  StringRef macroName_x00129;
  StringRef macroName_x00130;
  StringRef macroName_x00131;
  StringRef macroName_x00132;
  StringRef macroName_x00133;
  StringRef macroName_x00134;
  StringRef macroName_x00135;
  StringRef macroName_x00136;
  StringRef macroName_x00137;
  StringRef macroName_x00138;
  StringRef macroName_x00139;
  StringRef macroName_x00140;
  StringRef macroName_x00141;
  StringRef macroName_x00142;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  StringRef capturedExpression_46;
  StringRef capturedExpression_47;
  StringRef capturedExpression_48;
  StringRef capturedExpression_49;
  StringRef capturedExpression_50;
  StringRef capturedExpression_51;
  StringRef capturedExpression_52;
  StringRef capturedExpression_53;
  StringRef capturedExpression_54;
  StringRef capturedExpression_55;
  StringRef capturedExpression_56;
  StringRef capturedExpression_57;
  StringRef capturedExpression_58;
  StringRef capturedExpression_59;
  StringRef capturedExpression_60;
  StringRef capturedExpression_61;
  StringRef capturedExpression_62;
  StringRef capturedExpression_63;
  StringRef capturedExpression_64;
  StringRef capturedExpression_65;
  StringRef capturedExpression_66;
  StringRef capturedExpression_67;
  StringRef capturedExpression_68;
  StringRef capturedExpression_69;
  StringRef capturedExpression_70;
  StringRef capturedExpression_71;
  StringRef capturedExpression_72;
  StringRef capturedExpression_73;
  StringRef capturedExpression_74;
  StringRef capturedExpression_75;
  StringRef capturedExpression_76;
  StringRef capturedExpression_77;
  StringRef capturedExpression_78;
  StringRef capturedExpression_79;
  StringRef capturedExpression_80;
  StringRef capturedExpression_81;
  StringRef capturedExpression_82;
  StringRef capturedExpression_83;
  StringRef capturedExpression_84;
  StringRef capturedExpression_85;
  StringRef capturedExpression_86;
  StringRef capturedExpression_87;
  StringRef capturedExpression_88;
  StringRef capturedExpression_89;
  StringRef capturedExpression_90;
  StringRef capturedExpression_91;
  StringRef capturedExpression_92;
  StringRef capturedExpression_93;
  StringRef capturedExpression_94;
  StringRef capturedExpression_95;
  StringRef capturedExpression_96;
  StringRef capturedExpression_97;
  StringRef capturedExpression_98;
  StringRef capturedExpression_99;
  StringRef capturedExpression_x00100;
  StringRef capturedExpression_x00101;
  StringRef capturedExpression_x00102;
  StringRef capturedExpression_x00103;
  StringRef capturedExpression_x00104;
  StringRef capturedExpression_x00105;
  StringRef capturedExpression_x00106;
  StringRef capturedExpression_x00107;
  StringRef capturedExpression_x00108;
  StringRef capturedExpression_x00109;
  StringRef capturedExpression_x00110;
  StringRef capturedExpression_x00111;
  StringRef capturedExpression_x00112;
  StringRef capturedExpression_x00113;
  StringRef capturedExpression_x00114;
  StringRef capturedExpression_x00115;
  StringRef capturedExpression_x00116;
  StringRef capturedExpression_x00117;
  StringRef capturedExpression_x00118;
  StringRef capturedExpression_x00119;
  StringRef capturedExpression_x00120;
  StringRef capturedExpression_x00121;
  StringRef capturedExpression_x00122;
  StringRef capturedExpression_x00123;
  StringRef capturedExpression_x00124;
  StringRef capturedExpression_x00125;
  StringRef capturedExpression_x00126;
  StringRef capturedExpression_x00127;
  StringRef capturedExpression_x00128;
  StringRef capturedExpression_x00129;
  StringRef capturedExpression_x00130;
  StringRef capturedExpression_x00131;
  StringRef capturedExpression_x00132;
  StringRef capturedExpression_x00133;
  StringRef capturedExpression_x00134;
  StringRef capturedExpression_x00135;
  StringRef capturedExpression_x00136;
  StringRef capturedExpression_x00137;
  StringRef capturedExpression_x00138;
  StringRef capturedExpression_x00139;
  StringRef capturedExpression_x00140;
  StringRef capturedExpression_x00141;
  StringRef capturedExpression_x00142;
  AssertionHandler catchAssertionHandler_17;
  undefined1 local_138 [8];
  undefined8 local_130;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_128;
  undefined1 local_120 [8];
  int local_118;
  undefined4 uStack_114;
  double local_100;
  MatchExpr<int,_Catch::Matchers::WithinRelMatcher> local_f8;
  undefined1 local_d8 [8];
  bool local_d0;
  bool bStack_cf;
  undefined2 uStack_ce;
  undefined4 uStack_cc;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_c8;
  _Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
  local_c0;
  undefined8 local_b8;
  FissionYieldData data;
  range_reference_t<D<true>_> local_50;
  
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size = 0x153;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x11;
  capturedExpression.m_start = "454 == chunk.MT()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName,(SourceLineInfo *)&catchAssertionHandler_17,
             capturedExpression,ContinueOnFailure);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size =
       CONCAT62(catchAssertionHandler_17.m_assertionInfo.macroName.m_size._2_6_,0x101);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001e4230;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size =
       CONCAT44(0x1c6,(undefined4)catchAssertionHandler_17.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_17.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_17.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_17.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT44(catchAssertionHandler_17.m_assertionInfo.capturedExpression.m_start._4_4_,
                        0x1c6);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&data,(ITransientExpression *)&catchAssertionHandler_17);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_17);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size = 0x154;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x1c;
  capturedExpression_00.m_start = "454 == chunk.sectionNumber()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_00,(SourceLineInfo *)&catchAssertionHandler_17,
             capturedExpression_00,ContinueOnFailure);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size =
       CONCAT62(catchAssertionHandler_17.m_assertionInfo.macroName.m_size._2_6_,0x101);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001e4230;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size =
       CONCAT44(0x1c6,(undefined4)catchAssertionHandler_17.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_17.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_17.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_17.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT44(catchAssertionHandler_17.m_assertionInfo.capturedExpression.m_start._4_4_,
                        0x1c6);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&data,(ITransientExpression *)&catchAssertionHandler_17);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_17);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size = 0x156;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x13;
  capturedExpression_01.m_start = "92235 == chunk.ZA()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_01,(SourceLineInfo *)&catchAssertionHandler_17,
             capturedExpression_01,ContinueOnFailure);
  iVar1 = (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<8,_454>_>).ZA_;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(iVar1 == 0x1684b,1);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001e4230;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size =
       CONCAT44(0x1684b,(undefined4)catchAssertionHandler_17.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_17.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_17.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_17.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT44(catchAssertionHandler_17.m_assertionInfo.capturedExpression.m_start._4_4_,
                        iVar1);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&data,(ITransientExpression *)&catchAssertionHandler_17);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_17);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size = 0x157;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x21;
  capturedExpression_02.m_start = "92235 == chunk.targetIdentifier()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_02,(SourceLineInfo *)&catchAssertionHandler_17,
             capturedExpression_02,ContinueOnFailure);
  iVar1 = (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<8,_454>_>).ZA_;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(iVar1 == 0x1684b,1);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001e4230;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size =
       CONCAT44(0x1684b,(undefined4)catchAssertionHandler_17.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_17.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_17.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_17.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT44(catchAssertionHandler_17.m_assertionInfo.capturedExpression.m_start._4_4_,
                        iVar1);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&data,(ITransientExpression *)&catchAssertionHandler_17);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_17);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size = 0x158;
  macroName_03.m_size = 10;
  macroName_03.m_start = "CHECK_THAT";
  capturedExpression_03.m_size = 0x22;
  capturedExpression_03.m_start = "233.0250, WithinRel( chunk.AWR() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_03,(SourceLineInfo *)&catchAssertionHandler_17,
             capturedExpression_03,ContinueOnFailure);
  local_d8 = (undefined1  [8])0x406d20cccccccccd;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_17,
             (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<8,_454>_>).atomicWeightRatio_);
  bVar4 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)&catchAssertionHandler_17,(double *)local_d8);
  local_130._1_1_ = bVar4;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4270;
  local_128._M_current = (double *)local_d8;
  local_120 = (undefined1  [8])&catchAssertionHandler_17;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&data,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_17);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size = 0x159;
  macroName_04.m_size = 10;
  macroName_04.m_start = "CHECK_THAT";
  capturedExpression_04.m_size = 0x30;
  capturedExpression_04.m_start = "233.0250, WithinRel( chunk.atomicWeightRatio() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_04,(SourceLineInfo *)&catchAssertionHandler_17,
             capturedExpression_04,ContinueOnFailure);
  local_d8 = (undefined1  [8])0x406d20cccccccccd;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_17,
             (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<8,_454>_>).atomicWeightRatio_);
  local_130._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_17,(double *)local_d8);
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4270;
  local_128._M_current = (double *)local_d8;
  local_120 = (undefined1  [8])&catchAssertionHandler_17;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&data,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_17);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size = 0x15b;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0x13;
  capturedExpression_05.m_start = "false == chunk.LE()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_05,(SourceLineInfo *)&catchAssertionHandler_17,
             capturedExpression_05,ContinueOnFailure);
  sVar2 = catchAssertionHandler_17.m_assertionInfo.macroName.m_size;
  bVar4 = (long)(chunk->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x48;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(!bVar4,1);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start = "&\x16\x14";
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size._3_5_ = SUB85(sVar2,3);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size._0_3_ =
       CONCAT12(0,(ushort)catchAssertionHandler_17.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_17.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_17.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_17.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT71(catchAssertionHandler_17.m_assertionInfo.capturedExpression.m_start._1_7_,
                        bVar4);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&data,(ITransientExpression *)&catchAssertionHandler_17);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_17);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size = 0x15c;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x24;
  capturedExpression_06.m_start = "false == chunk.isEnergyIndependent()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_06,(SourceLineInfo *)&catchAssertionHandler_17,
             capturedExpression_06,ContinueOnFailure);
  sVar2 = catchAssertionHandler_17.m_assertionInfo.macroName.m_size;
  bVar4 = (long)(chunk->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x48;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(!bVar4,1);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start = "&\x16\x14";
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size._3_5_ = SUB85(sVar2,3);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size._0_3_ =
       CONCAT12(0,(ushort)catchAssertionHandler_17.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_17.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_17.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_17.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT71(catchAssertionHandler_17.m_assertionInfo.capturedExpression.m_start._1_7_,
                        bVar4);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&data,(ITransientExpression *)&catchAssertionHandler_17);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_17);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size = 0x15e;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0xf;
  capturedExpression_07.m_start = "2 == chunk.NE()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_07,(SourceLineInfo *)&catchAssertionHandler_17,
             capturedExpression_07,ContinueOnFailure);
  lVar6 = (long)(chunk->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_start;
  catchAssertionHandler_17.m_assertionInfo.capturedExpression.m_start = (char *)(lVar6 / 0x48);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(lVar6 == 0x90,1);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start = "$\x17\x14";
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size =
       CONCAT44(2,(undefined4)catchAssertionHandler_17.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_17.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_17.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&data,(ITransientExpression *)&catchAssertionHandler_17);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_17);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size = 0x15f;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x23;
  capturedExpression_08.m_start = "2 == chunk.numberIncidentEnergies()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_08,(SourceLineInfo *)&catchAssertionHandler_17,
             capturedExpression_08,ContinueOnFailure);
  lVar6 = (long)(chunk->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_start;
  catchAssertionHandler_17.m_assertionInfo.capturedExpression.m_start = (char *)(lVar6 / 0x48);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(lVar6 == 0x90,1);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start = "$\x17\x14";
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size =
       CONCAT44(2,(undefined4)catchAssertionHandler_17.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_17.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_17.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&data,(ITransientExpression *)&catchAssertionHandler_17);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_17);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size = 0x160;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0x15;
  capturedExpression_09.m_start = "2 == chunk.E().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_09,(SourceLineInfo *)&catchAssertionHandler_17,
             capturedExpression_09,ContinueOnFailure);
  lVar6 = (long)(chunk->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_start;
  catchAssertionHandler_17.m_assertionInfo.capturedExpression.m_start = (char *)(lVar6 / 0x48);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(lVar6 == 0x90,1);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001e4330;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size =
       CONCAT44(2,(undefined4)catchAssertionHandler_17.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_17.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_17.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&data,(ITransientExpression *)&catchAssertionHandler_17);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_17);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size = 0x161;
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  capturedExpression_10.m_size = 0x24;
  capturedExpression_10.m_start = "2 == chunk.incidentEnergies().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_10,(SourceLineInfo *)&catchAssertionHandler_17,
             capturedExpression_10,ContinueOnFailure);
  lVar6 = (long)(chunk->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_start;
  catchAssertionHandler_17.m_assertionInfo.capturedExpression.m_start = (char *)(lVar6 / 0x48);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(lVar6 == 0x90,1);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001e4330;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size =
       CONCAT44(2,(undefined4)catchAssertionHandler_17.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_17.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_17.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&data,(ITransientExpression *)&catchAssertionHandler_17);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_17);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size = 0x162;
  macroName_11.m_size = 10;
  macroName_11.m_start = "CHECK_THAT";
  capturedExpression_11.m_size = 0x21;
  capturedExpression_11.m_start = "0.0253, WithinRel( chunk.E()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_11,(SourceLineInfo *)&catchAssertionHandler_17,
             capturedExpression_11,ContinueOnFailure);
  local_d8 = (undefined1  [8])0x3f99e83e425aee63;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_17,
             ((_Head_base<0UL,_double,_false> *)
             ((long)&(((chunk->data_).
                       super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).metadata.fields
             + 0x28))->_M_head_impl);
  local_130._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_17,(double *)local_d8);
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4270;
  local_128._M_current = (double *)local_d8;
  local_120 = (undefined1  [8])&catchAssertionHandler_17;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&data,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_17);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size = 0x163;
  macroName_12.m_size = 10;
  macroName_12.m_start = "CHECK_THAT";
  capturedExpression_12.m_size = 0x21;
  capturedExpression_12.m_start = "500e+3, WithinRel( chunk.E()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_12,(SourceLineInfo *)&catchAssertionHandler_17,
             capturedExpression_12,ContinueOnFailure);
  local_d8 = (undefined1  [8])0x411e848000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_17,
             ((_Head_base<0UL,_double,_false> *)
             ((long)&(chunk->data_).
                     super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].super_ListRecord.metadata.fields +
             0x28))->_M_head_impl);
  local_130._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_17,(double *)local_d8);
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4270;
  local_128._M_current = (double *)local_d8;
  local_120 = (undefined1  [8])&catchAssertionHandler_17;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&data,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_17);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size = 0x164;
  macroName_13.m_size = 10;
  macroName_13.m_start = "CHECK_THAT";
  capturedExpression_13.m_size = 0x30;
  capturedExpression_13.m_start = "0.0253, WithinRel( chunk.incidentEnergies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_13,(SourceLineInfo *)&catchAssertionHandler_17,
             capturedExpression_13,ContinueOnFailure);
  local_d8 = (undefined1  [8])0x3f99e83e425aee63;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_17,
             ((_Head_base<0UL,_double,_false> *)
             ((long)&(((chunk->data_).
                       super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).metadata.fields
             + 0x28))->_M_head_impl);
  local_130._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_17,(double *)local_d8);
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4270;
  local_128._M_current = (double *)local_d8;
  local_120 = (undefined1  [8])&catchAssertionHandler_17;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&data,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_17);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size = 0x165;
  macroName_14.m_size = 10;
  macroName_14.m_start = "CHECK_THAT";
  capturedExpression_14.m_size = 0x30;
  capturedExpression_14.m_start = "500e+3, WithinRel( chunk.incidentEnergies()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_14,(SourceLineInfo *)&catchAssertionHandler_17,
             capturedExpression_14,ContinueOnFailure);
  local_d8 = (undefined1  [8])0x411e848000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_17,
             ((_Head_base<0UL,_double,_false> *)
             ((long)&(chunk->data_).
                     super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].super_ListRecord.metadata.fields +
             0x28))->_M_head_impl);
  local_130._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_17,(double *)local_d8);
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4270;
  local_128._M_current = (double *)local_d8;
  local_120 = (undefined1  [8])&catchAssertionHandler_17;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&data,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_17);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size = 0x167;
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  capturedExpression_15.m_size = 0x1a;
  capturedExpression_15.m_start = "2 == chunk.yields().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_15,(SourceLineInfo *)&catchAssertionHandler_17,
             capturedExpression_15,ContinueOnFailure);
  lVar6 = (long)(chunk->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_start;
  catchAssertionHandler_17.m_assertionInfo.capturedExpression.m_start = (char *)(lVar6 / 0x48);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(lVar6 == 0x90,1);
  catchAssertionHandler_17.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001e4330;
  catchAssertionHandler_17.m_assertionInfo.macroName.m_size =
       CONCAT44(2,(undefined4)catchAssertionHandler_17.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_17.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_17.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&data,(ITransientExpression *)&catchAssertionHandler_17);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_17);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  njoy::ENDFtk::ListRecord::ListRecord
            (&data.super_ListRecord,
             &((chunk->data_).
               super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
               ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x16a;
  macroName_16.m_size = 5;
  macroName_16.m_start = "CHECK";
  capturedExpression_16.m_size = 0xd;
  capturedExpression_16.m_start = "1 == data.I()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_16,(SourceLineInfo *)local_138,
             capturedExpression_16,ContinueOnFailure);
  local_130._1_1_ =
       (int)data.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
            _M_head_impl == 1;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4230;
  local_130._4_4_ = 1;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x16b;
  macroName_17.m_size = 5;
  macroName_17.m_start = "CHECK";
  capturedExpression_17.m_size = 0x1d;
  capturedExpression_17.m_start = "1 == data.interpolationType()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_17,(SourceLineInfo *)local_138,
             capturedExpression_17,ContinueOnFailure);
  local_130._1_1_ =
       (int)data.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
            _M_head_impl == 1;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4230;
  local_130._4_4_ = 1;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  local_118 = (int)data.super_ListRecord.metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>
                   ._M_head_impl;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x16c;
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  capturedExpression_18.m_size = 0x12;
  capturedExpression_18.m_start = "false == data.LE()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_18,(SourceLineInfo *)local_138,
             capturedExpression_18,ContinueOnFailure);
  _Var3._M_p = local_130;
  local_130._0_2_ =
       CONCAT11((int)data.super_ListRecord.metadata.fields.
                     super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                     super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                     super__Tuple_impl<2UL,_long,_long,_long,_long>.
                     super__Head_base<2UL,_long,_false>._M_head_impl != 0,1);
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e42b0;
  local_130._3_5_ = SUB85(_Var3._M_p,3);
  local_130._0_3_ = (uint3)(ushort)local_130;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  local_118._0_1_ =
       (int)data.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
            _M_head_impl == 0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x16d;
  macroName_19.m_size = 5;
  macroName_19.m_start = "CHECK";
  capturedExpression_19.m_size = 0x23;
  capturedExpression_19.m_start = "false == data.isEnergyIndependent()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_19,(SourceLineInfo *)local_138,
             capturedExpression_19,ContinueOnFailure);
  _Var3._M_p = local_130;
  local_130._0_2_ =
       CONCAT11((int)data.super_ListRecord.metadata.fields.
                     super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                     super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                     super__Tuple_impl<2UL,_long,_long,_long,_long>.
                     super__Head_base<2UL,_long,_false>._M_head_impl != 0,1);
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e42b0;
  local_130._3_5_ = SUB85(_Var3._M_p,3);
  local_130._0_3_ = (uint3)(ushort)local_130;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  local_118._0_1_ =
       (int)data.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
            _M_head_impl == 0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x16e;
  macroName_20.m_size = 5;
  macroName_20.m_start = "CHECK";
  capturedExpression_20.m_size = 0xf;
  capturedExpression_20.m_start = "3 == data.NFP()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_20,(SourceLineInfo *)local_138,
             capturedExpression_20,ContinueOnFailure);
  local_130._1_1_ =
       (int)data.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
            super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
            super__Head_base<5UL,_long,_false>._M_head_impl == 3;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4230;
  local_130._4_4_ = 3;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x16f;
  macroName_21.m_size = 5;
  macroName_21.m_start = "CHECK";
  capturedExpression_21.m_size = 0x21;
  capturedExpression_21.m_start = "3 == data.numberFissionProducts()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_21,(SourceLineInfo *)local_138,
             capturedExpression_21,ContinueOnFailure);
  local_130._1_1_ =
       (int)data.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
            super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
            super__Head_base<5UL,_long,_false>._M_head_impl == 3;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4230;
  local_130._4_4_ = 3;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  local_118 = (int)data.super_ListRecord.metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.
                   super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                   super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x170;
  macroName_22.m_size = 10;
  macroName_22.m_start = "CHECK_THAT";
  capturedExpression_22.m_size = 0x1d;
  capturedExpression_22.m_start = "0.0253, WithinRel( data.E() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_22,(SourceLineInfo *)local_138,
             capturedExpression_22,ContinueOnFailure);
  local_f8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x3f99e83e425aee63;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             data.super_ListRecord.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bStack_cf = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_138,(double *)&local_f8);
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4270;
  local_c8._M_current = (double *)&local_f8;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_138;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x171;
  macroName_23.m_size = 10;
  macroName_23.m_start = "CHECK_THAT";
  capturedExpression_23.m_size = 0x2a;
  capturedExpression_23.m_start = "0.0253, WithinRel( data.incidentEnergy() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_23,(SourceLineInfo *)local_138,
             capturedExpression_23,ContinueOnFailure);
  local_f8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x3f99e83e425aee63;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             data.super_ListRecord.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bStack_cf = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_138,(double *)&local_f8);
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4270;
  local_c8._M_current = (double *)&local_f8;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_138;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x173;
  macroName_24.m_size = 5;
  macroName_24.m_start = "CHECK";
  capturedExpression_24.m_size = 0x22;
  capturedExpression_24.m_start = "3 == data.fissionProducts().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_24,(SourceLineInfo *)local_138,
             capturedExpression_24,ContinueOnFailure);
  this = &data.super_ListRecord.data;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  _local_118 = ranges::
               chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::
               size<concepts::detail::CPP_true_fn(concepts::detail::Nil)>();
  local_130._1_1_ = _local_118 == 3;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  local_130._4_4_ = 3;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x174;
  macroName_25.m_size = 5;
  macroName_25.m_start = "CHECK";
  capturedExpression_25.m_size = 0x29;
  capturedExpression_25.m_start = "23066 == data.fissionProducts()[0].ZAFP()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_25,(SourceLineInfo *)local_138,
             capturedExpression_25,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  local_130._1_1_ = (int)(long)*(double *)local_f8.m_arg == 0x5a1a;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130._4_4_ = 0x5a1a;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  local_118 = (int)(long)*(double *)local_f8.m_arg;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x175;
  macroName_26.m_size = 5;
  macroName_26.m_start = "CHECK";
  capturedExpression_26.m_size = 0x29;
  capturedExpression_26.m_start = "54135 == data.fissionProducts()[1].ZAFP()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_26,(SourceLineInfo *)local_138,
             capturedExpression_26,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  local_118 = (int)(long)*(double *)local_f8.m_arg;
  local_130._1_1_ = local_118 == 0xd377;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130._4_4_ = 0xd377;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x176;
  macroName_27.m_size = 5;
  macroName_27.m_start = "CHECK";
  capturedExpression_27.m_size = 0x29;
  capturedExpression_27.m_start = "72171 == data.fissionProducts()[2].ZAFP()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_27,(SourceLineInfo *)local_138,
             capturedExpression_27,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  local_118 = (int)(long)*(double *)local_f8.m_arg;
  local_130._1_1_ = local_118 == 0x119eb;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130._4_4_ = 0x119eb;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x177;
  macroName_28.m_size = 5;
  macroName_28.m_start = "CHECK";
  capturedExpression_28.m_size = 0x3d;
  capturedExpression_28.m_start = "23066 == data.fissionProducts()[0].fissionProductIdentifier()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_28,(SourceLineInfo *)local_138,
             capturedExpression_28,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  local_118 = (int)(long)*(double *)local_f8.m_arg;
  local_130._1_1_ = local_118 == 0x5a1a;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130._4_4_ = 0x5a1a;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x178;
  macroName_29.m_size = 5;
  macroName_29.m_start = "CHECK";
  capturedExpression_29.m_size = 0x3d;
  capturedExpression_29.m_start = "54135 == data.fissionProducts()[1].fissionProductIdentifier()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_29,(SourceLineInfo *)local_138,
             capturedExpression_29,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  local_118 = (int)(long)*(double *)local_f8.m_arg;
  local_130._1_1_ = local_118 == 0xd377;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130._4_4_ = 0xd377;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x179;
  macroName_30.m_size = 5;
  macroName_30.m_start = "CHECK";
  capturedExpression_30.m_size = 0x3d;
  capturedExpression_30.m_start = "72171 == data.fissionProducts()[2].fissionProductIdentifier()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_30,(SourceLineInfo *)local_138,
             capturedExpression_30,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  local_118 = (int)(long)*(double *)local_f8.m_arg;
  local_130._1_1_ = local_118 == 0x119eb;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130._4_4_ = 0x119eb;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x17a;
  macroName_31.m_size = 5;
  macroName_31.m_start = "CHECK";
  capturedExpression_31.m_size = 0x24;
  capturedExpression_31.m_start = "0 == data.fissionProducts()[0].FPS()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_31,(SourceLineInfo *)local_138,
             capturedExpression_31,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  local_118 = (int)(long)*(double *)((long)local_f8.m_arg + 8);
  local_130._1_1_ = local_118 == 0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x17b;
  macroName_32.m_size = 5;
  macroName_32.m_start = "CHECK";
  capturedExpression_32.m_size = 0x24;
  capturedExpression_32.m_start = "0 == data.fissionProducts()[1].FPS()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_32,(SourceLineInfo *)local_138,
             capturedExpression_32,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  local_118 = (int)(long)*(double *)((long)local_f8.m_arg + 8);
  local_130._1_1_ = local_118 == 0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x17c;
  macroName_33.m_size = 5;
  macroName_33.m_start = "CHECK";
  capturedExpression_33.m_size = 0x24;
  capturedExpression_33.m_start = "0 == data.fissionProducts()[2].FPS()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_33,(SourceLineInfo *)local_138,
             capturedExpression_33,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  local_118 = (int)(long)*(double *)((long)local_f8.m_arg + 8);
  local_130._1_1_ = local_118 == 0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x17d;
  macroName_34.m_size = 5;
  macroName_34.m_start = "CHECK";
  capturedExpression_34.m_size = 0x2e;
  capturedExpression_34.m_start = "0 == data.fissionProducts()[0].isomericState()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_34,(SourceLineInfo *)local_138,
             capturedExpression_34,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  local_118 = (int)(long)*(double *)((long)local_f8.m_arg + 8);
  local_130._1_1_ = local_118 == 0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x17e;
  macroName_35.m_size = 5;
  macroName_35.m_start = "CHECK";
  capturedExpression_35.m_size = 0x2e;
  capturedExpression_35.m_start = "0 == data.fissionProducts()[1].isomericState()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_35,(SourceLineInfo *)local_138,
             capturedExpression_35,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  local_118 = (int)(long)*(double *)((long)local_f8.m_arg + 8);
  local_130._1_1_ = local_118 == 0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x17f;
  macroName_36.m_size = 5;
  macroName_36.m_start = "CHECK";
  capturedExpression_36.m_size = 0x2e;
  capturedExpression_36.m_start = "0 == data.fissionProducts()[2].isomericState()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_36,(SourceLineInfo *)local_138,
             capturedExpression_36,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  local_130._1_1_ = (int)(long)*(double *)((long)local_f8.m_arg + 8) == 0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  local_118 = (int)(long)*(double *)((long)local_f8.m_arg + 8);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x180;
  macroName_37.m_size = 10;
  macroName_37.m_start = "CHECK_THAT";
  capturedExpression_37.m_size = 0x3a;
  capturedExpression_37.m_start = "2.05032e-19, WithinRel( data.fissionProducts()[0].Y()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_37,(SourceLineInfo *)local_138,
             capturedExpression_37,ContinueOnFailure);
  local_100 = 2.05032e-19;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_50,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 0x10));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x181;
  macroName_38.m_size = 10;
  macroName_38.m_start = "CHECK_THAT";
  capturedExpression_38.m_size = 0x3a;
  capturedExpression_38.m_start = "1.31220e-19, WithinRel( data.fissionProducts()[0].Y()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_38,(SourceLineInfo *)local_138,
             capturedExpression_38,ContinueOnFailure);
  local_100 = 1.3122e-19;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_50,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 0x18));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x182;
  macroName_39.m_size = 10;
  macroName_39.m_start = "CHECK_THAT";
  capturedExpression_39.m_size = 0x3a;
  capturedExpression_39.m_start = "7.851250e-4, WithinRel( data.fissionProducts()[1].Y()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_39,(SourceLineInfo *)local_138,
             capturedExpression_39,ContinueOnFailure);
  local_100 = 0.000785125;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_50,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 0x10));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x183;
  macroName_40.m_size = 10;
  macroName_40.m_start = "CHECK_THAT";
  capturedExpression_40.m_size = 0x3a;
  capturedExpression_40.m_start = "4.710750e-5, WithinRel( data.fissionProducts()[1].Y()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_40,(SourceLineInfo *)local_138,
             capturedExpression_40,ContinueOnFailure);
  local_100 = 4.71075e-05;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_50,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 0x18));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x184;
  macroName_41.m_size = 10;
  macroName_41.m_start = "CHECK_THAT";
  capturedExpression_41.m_size = 0x30;
  capturedExpression_41.m_start = "0, WithinRel( data.fissionProducts()[2].Y()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_41,(SourceLineInfo *)local_138,
             capturedExpression_41,ContinueOnFailure);
  local_100 = (double)((ulong)local_100 & 0xffffffff00000000);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_50,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 0x10));
  Catch::MatchExpr<int,_Catch::Matchers::WithinRelMatcher>::MatchExpr
            (&local_f8,(int *)&local_100,(WithinRelMatcher *)local_138);
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x185;
  macroName_42.m_size = 10;
  macroName_42.m_start = "CHECK_THAT";
  capturedExpression_42.m_size = 0x30;
  capturedExpression_42.m_start = "0, WithinRel( data.fissionProducts()[2].Y()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_42,(SourceLineInfo *)local_138,
             capturedExpression_42,ContinueOnFailure);
  local_100 = (double)((ulong)local_100 & 0xffffffff00000000);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_50,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 0x18));
  Catch::MatchExpr<int,_Catch::Matchers::WithinRelMatcher>::MatchExpr
            (&local_f8,(int *)&local_100,(WithinRelMatcher *)local_138);
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x187;
  macroName_43.m_size = 5;
  macroName_43.m_start = "CHECK";
  capturedExpression_43.m_size = 0x17;
  capturedExpression_43.m_start = "3 == data.ZAFP().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_43,(SourceLineInfo *)local_138,
             capturedExpression_43,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  _local_118 = (((CONCAT44(uStack_cc,CONCAT22(uStack_ce,CONCAT11(bStack_cf,local_d0))) -
                  (long)local_c8._M_current >> 3) + (long)local_c0._M_head_impl._M_current) - 1U) /
               (ulong)local_c0._M_head_impl._M_current;
  local_130._1_1_ = _local_118 == 3;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  local_130._4_4_ = 3;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x188;
  macroName_44.m_size = 5;
  macroName_44.m_start = "CHECK";
  capturedExpression_44.m_size = 0x2c;
  capturedExpression_44.m_start = "3 == data.fissionProductIdentifiers().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_44,(SourceLineInfo *)local_138,
             capturedExpression_44,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  _local_118 = (((CONCAT44(uStack_cc,CONCAT22(uStack_ce,CONCAT11(bStack_cf,local_d0))) -
                  (long)local_c8._M_current >> 3) + (long)local_c0._M_head_impl._M_current) - 1U) /
               (ulong)local_c0._M_head_impl._M_current;
  local_130._1_1_ = _local_118 == 3;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  local_130._4_4_ = 3;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x189;
  macroName_45.m_size = 5;
  macroName_45.m_start = "CHECK";
  capturedExpression_45.m_size = 0x16;
  capturedExpression_45.m_start = "3 == data.FPS().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_45,(SourceLineInfo *)local_138,
             capturedExpression_45,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  _local_118 = (((CONCAT44(uStack_cc,CONCAT22(uStack_ce,CONCAT11(bStack_cf,local_d0))) -
                  (long)local_c8._M_current >> 3) + (long)local_c0._M_head_impl._M_current) - 1U) /
               (ulong)local_c0._M_head_impl._M_current;
  local_130._1_1_ = _local_118 == 3;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  local_130._4_4_ = 3;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x18a;
  macroName_46.m_size = 5;
  macroName_46.m_start = "CHECK";
  capturedExpression_46.m_size = 0x21;
  capturedExpression_46.m_start = "3 == data.isomericStates().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_46,(SourceLineInfo *)local_138,
             capturedExpression_46,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  _local_118 = (((CONCAT44(uStack_cc,CONCAT22(uStack_ce,CONCAT11(bStack_cf,local_d0))) -
                  (long)local_c8._M_current >> 3) + (long)local_c0._M_head_impl._M_current) - 1U) /
               (ulong)local_c0._M_head_impl._M_current;
  local_130._1_1_ = _local_118 == 3;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  local_130._4_4_ = 3;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x18b;
  macroName_47.m_size = 5;
  macroName_47.m_start = "CHECK";
  capturedExpression_47.m_size = 0x14;
  capturedExpression_47.m_start = "3 == data.Y().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_47,(SourceLineInfo *)local_138,
             capturedExpression_47,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  local_b8 = (WithinRelMatcher *)
             ranges::
             stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
             ::size<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
                       ((stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
                         *)local_138);
  bStack_cf = local_b8 == (WithinRelMatcher *)0x3;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 3;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x18c;
  macroName_48.m_size = 5;
  macroName_48.m_start = "CHECK";
  capturedExpression_48.m_size = 0x20;
  capturedExpression_48.m_start = "3 == data.fissionYields().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_48,(SourceLineInfo *)local_138,
             capturedExpression_48,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  local_b8 = (WithinRelMatcher *)
             ranges::
             stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
             ::size<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
                       ((stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
                         *)local_138);
  bStack_cf = local_b8 == (WithinRelMatcher *)0x3;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 3;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x18d;
  macroName_49.m_size = 5;
  macroName_49.m_start = "CHECK";
  capturedExpression_49.m_size = 0x17;
  capturedExpression_49.m_start = "23066 == data.ZAFP()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_49,(SourceLineInfo *)local_138,
             capturedExpression_49,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,0);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 23066.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130._4_4_ = 0x5a1a;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x18e;
  macroName_50.m_size = 5;
  macroName_50.m_start = "CHECK";
  capturedExpression_50.m_size = 0x17;
  capturedExpression_50.m_start = "54135 == data.ZAFP()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_50,(SourceLineInfo *)local_138,
             capturedExpression_50,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,1);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 54135.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130._4_4_ = 0xd377;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x18f;
  macroName_51.m_size = 5;
  macroName_51.m_start = "CHECK";
  capturedExpression_51.m_size = 0x17;
  capturedExpression_51.m_start = "72171 == data.ZAFP()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_51,(SourceLineInfo *)local_138,
             capturedExpression_51,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,2);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 72171.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130._4_4_ = 0x119eb;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x190;
  macroName_52.m_size = 5;
  macroName_52.m_start = "CHECK";
  capturedExpression_52.m_size = 0x2c;
  capturedExpression_52.m_start = "23066 == data.fissionProductIdentifiers()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_52,(SourceLineInfo *)local_138,
             capturedExpression_52,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,0);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 23066.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130._4_4_ = 0x5a1a;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x191;
  macroName_53.m_size = 5;
  macroName_53.m_start = "CHECK";
  capturedExpression_53.m_size = 0x2c;
  capturedExpression_53.m_start = "54135 == data.fissionProductIdentifiers()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_53,(SourceLineInfo *)local_138,
             capturedExpression_53,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,1);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 54135.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130._4_4_ = 0xd377;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x192;
  macroName_54.m_size = 5;
  macroName_54.m_start = "CHECK";
  capturedExpression_54.m_size = 0x2c;
  capturedExpression_54.m_start = "72171 == data.fissionProductIdentifiers()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_54,(SourceLineInfo *)local_138,
             capturedExpression_54,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,2);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 72171.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130._4_4_ = 0x119eb;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x193;
  macroName_55.m_size = 5;
  macroName_55.m_start = "CHECK";
  capturedExpression_55.m_size = 0x12;
  capturedExpression_55.m_start = "0 == data.FPS()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_55,(SourceLineInfo *)local_138,
             capturedExpression_55,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,0);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 0.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x194;
  macroName_56.m_size = 5;
  macroName_56.m_start = "CHECK";
  capturedExpression_56.m_size = 0x12;
  capturedExpression_56.m_start = "0 == data.FPS()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_56,(SourceLineInfo *)local_138,
             capturedExpression_56,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,1);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 0.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x195;
  macroName_57.m_size = 5;
  macroName_57.m_start = "CHECK";
  capturedExpression_57.m_size = 0x12;
  capturedExpression_57.m_start = "0 == data.FPS()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_57,(SourceLineInfo *)local_138,
             capturedExpression_57,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,2);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 0.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x196;
  macroName_58.m_size = 5;
  macroName_58.m_start = "CHECK";
  capturedExpression_58.m_size = 0x1d;
  capturedExpression_58.m_start = "0 == data.isomericStates()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_58,(SourceLineInfo *)local_138,
             capturedExpression_58,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,0);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 0.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x197;
  macroName_59.m_size = 5;
  macroName_59.m_start = "CHECK";
  capturedExpression_59.m_size = 0x1d;
  capturedExpression_59.m_start = "0 == data.isomericStates()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_59,(SourceLineInfo *)local_138,
             capturedExpression_59,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,1);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 0.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x198;
  macroName_60.m_size = 5;
  macroName_60.m_start = "CHECK";
  capturedExpression_60.m_size = 0x1d;
  capturedExpression_60.m_start = "0 == data.isomericStates()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_60,(SourceLineInfo *)local_138,
             capturedExpression_60,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,2);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 0.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x199;
  macroName_61.m_size = 5;
  macroName_61.m_start = "CHECK";
  capturedExpression_61.m_size = 0x17;
  capturedExpression_61.m_start = "2 == data.Y()[0].size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_61,(SourceLineInfo *)local_138,
             capturedExpression_61,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_> *)&local_f8,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_138,0);
  local_b8 = (WithinRelMatcher *)
             (CONCAT62(local_f8.super_ITransientExpression._10_6_,
                       CONCAT11(local_f8.super_ITransientExpression.m_result,
                                local_f8.super_ITransientExpression.m_isBinaryExpression)) -
              (long)local_f8.m_arg >> 3);
  if (local_f8.m_matcher < local_b8) {
    local_b8 = local_f8.m_matcher;
  }
  bStack_cf = local_b8 == (WithinRelMatcher *)0x2;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 2;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x19a;
  macroName_62.m_size = 5;
  macroName_62.m_start = "CHECK";
  capturedExpression_62.m_size = 0x17;
  capturedExpression_62.m_start = "2 == data.Y()[1].size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_62,(SourceLineInfo *)local_138,
             capturedExpression_62,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_> *)&local_f8,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_138,1);
  local_b8 = (WithinRelMatcher *)
             (CONCAT62(local_f8.super_ITransientExpression._10_6_,
                       CONCAT11(local_f8.super_ITransientExpression.m_result,
                                local_f8.super_ITransientExpression.m_isBinaryExpression)) -
              (long)local_f8.m_arg >> 3);
  if (local_f8.m_matcher < local_b8) {
    local_b8 = local_f8.m_matcher;
  }
  bStack_cf = local_b8 == (WithinRelMatcher *)0x2;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 2;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x19b;
  macroName_63.m_size = 5;
  macroName_63.m_start = "CHECK";
  capturedExpression_63.m_size = 0x17;
  capturedExpression_63.m_start = "2 == data.Y()[2].size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_63,(SourceLineInfo *)local_138,
             capturedExpression_63,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_> *)&local_f8,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_138,2);
  local_b8 = (WithinRelMatcher *)
             (CONCAT62(local_f8.super_ITransientExpression._10_6_,
                       CONCAT11(local_f8.super_ITransientExpression.m_result,
                                local_f8.super_ITransientExpression.m_isBinaryExpression)) -
              (long)local_f8.m_arg >> 3);
  if (local_f8.m_matcher < local_b8) {
    local_b8 = local_f8.m_matcher;
  }
  bStack_cf = local_b8 == (WithinRelMatcher *)0x2;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 2;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x19c;
  macroName_64.m_size = 5;
  macroName_64.m_start = "CHECK";
  capturedExpression_64.m_size = 0x23;
  capturedExpression_64.m_start = "2 == data.fissionYields()[0].size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_64,(SourceLineInfo *)local_138,
             capturedExpression_64,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_> *)&local_f8,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_138,0);
  local_b8 = (WithinRelMatcher *)
             (CONCAT62(local_f8.super_ITransientExpression._10_6_,
                       CONCAT11(local_f8.super_ITransientExpression.m_result,
                                local_f8.super_ITransientExpression.m_isBinaryExpression)) -
              (long)local_f8.m_arg >> 3);
  if (local_f8.m_matcher < local_b8) {
    local_b8 = local_f8.m_matcher;
  }
  bStack_cf = local_b8 == (WithinRelMatcher *)0x2;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 2;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x19d;
  macroName_65.m_size = 5;
  macroName_65.m_start = "CHECK";
  capturedExpression_65.m_size = 0x23;
  capturedExpression_65.m_start = "2 == data.fissionYields()[1].size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_65,(SourceLineInfo *)local_138,
             capturedExpression_65,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_> *)&local_f8,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_138,1);
  local_b8 = (WithinRelMatcher *)
             (CONCAT62(local_f8.super_ITransientExpression._10_6_,
                       CONCAT11(local_f8.super_ITransientExpression.m_result,
                                local_f8.super_ITransientExpression.m_isBinaryExpression)) -
              (long)local_f8.m_arg >> 3);
  if (local_f8.m_matcher < local_b8) {
    local_b8 = local_f8.m_matcher;
  }
  bStack_cf = local_b8 == (WithinRelMatcher *)0x2;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 2;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x19e;
  macroName_66.m_size = 5;
  macroName_66.m_start = "CHECK";
  capturedExpression_66.m_size = 0x23;
  capturedExpression_66.m_start = "2 == data.fissionYields()[2].size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_66,(SourceLineInfo *)local_138,
             capturedExpression_66,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_> *)&local_f8,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_138,2);
  local_b8 = (WithinRelMatcher *)
             (CONCAT62(local_f8.super_ITransientExpression._10_6_,
                       CONCAT11(local_f8.super_ITransientExpression.m_result,
                                local_f8.super_ITransientExpression.m_isBinaryExpression)) -
              (long)local_f8.m_arg >> 3);
  if (local_f8.m_matcher < local_b8) {
    local_b8 = local_f8.m_matcher;
  }
  bStack_cf = local_b8 == (WithinRelMatcher *)0x2;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 2;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x19f;
  macroName_67.m_size = 10;
  macroName_67.m_start = "CHECK_THAT";
  capturedExpression_67.m_size = 0x28;
  capturedExpression_67.m_start = "2.05032e-19, WithinRel( data.Y()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_67,(SourceLineInfo *)local_138,
             capturedExpression_67,ContinueOnFailure);
  local_100 = 2.05032e-19;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1a0;
  macroName_68.m_size = 10;
  macroName_68.m_start = "CHECK_THAT";
  capturedExpression_68.m_size = 0x28;
  capturedExpression_68.m_start = "1.31220e-19, WithinRel( data.Y()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_68,(SourceLineInfo *)local_138,
             capturedExpression_68,ContinueOnFailure);
  local_100 = 1.3122e-19;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1a1;
  macroName_69.m_size = 10;
  macroName_69.m_start = "CHECK_THAT";
  capturedExpression_69.m_size = 0x28;
  capturedExpression_69.m_start = "7.851250e-4, WithinRel( data.Y()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_69,(SourceLineInfo *)local_138,
             capturedExpression_69,ContinueOnFailure);
  local_100 = 0.000785125;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1a2;
  macroName_70.m_size = 10;
  macroName_70.m_start = "CHECK_THAT";
  capturedExpression_70.m_size = 0x28;
  capturedExpression_70.m_start = "4.710750e-5, WithinRel( data.Y()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_70,(SourceLineInfo *)local_138,
             capturedExpression_70,ContinueOnFailure);
  local_100 = 4.71075e-05;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1a3;
  macroName_71.m_size = 10;
  macroName_71.m_start = "CHECK_THAT";
  capturedExpression_71.m_size = 0x1e;
  capturedExpression_71.m_start = "0, WithinRel( data.Y()[2][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_71,(SourceLineInfo *)local_138,
             capturedExpression_71,ContinueOnFailure);
  local_100 = (double)((ulong)local_100 & 0xffffffff00000000);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  Catch::MatchExpr<int,_Catch::Matchers::WithinRelMatcher>::MatchExpr
            (&local_f8,(int *)&local_100,(WithinRelMatcher *)local_138);
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1a4;
  macroName_72.m_size = 10;
  macroName_72.m_start = "CHECK_THAT";
  capturedExpression_72.m_size = 0x1e;
  capturedExpression_72.m_start = "0, WithinRel( data.Y()[2][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_72,(SourceLineInfo *)local_138,
             capturedExpression_72,ContinueOnFailure);
  local_100 = (double)((ulong)local_100 & 0xffffffff00000000);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  Catch::MatchExpr<int,_Catch::Matchers::WithinRelMatcher>::MatchExpr
            (&local_f8,(int *)&local_100,(WithinRelMatcher *)local_138);
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1a5;
  macroName_73.m_size = 10;
  macroName_73.m_start = "CHECK_THAT";
  capturedExpression_73.m_size = 0x34;
  capturedExpression_73.m_start = "2.05032e-19, WithinRel( data.fissionYields()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_73,(SourceLineInfo *)local_138,
             capturedExpression_73,ContinueOnFailure);
  local_100 = 2.05032e-19;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1a6;
  macroName_74.m_size = 10;
  macroName_74.m_start = "CHECK_THAT";
  capturedExpression_74.m_size = 0x34;
  capturedExpression_74.m_start = "1.31220e-19, WithinRel( data.fissionYields()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_74,(SourceLineInfo *)local_138,
             capturedExpression_74,ContinueOnFailure);
  local_100 = 1.3122e-19;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1a7;
  macroName_75.m_size = 10;
  macroName_75.m_start = "CHECK_THAT";
  capturedExpression_75.m_size = 0x34;
  capturedExpression_75.m_start = "7.851250e-4, WithinRel( data.fissionYields()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_75,(SourceLineInfo *)local_138,
             capturedExpression_75,ContinueOnFailure);
  local_100 = 0.000785125;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1a8;
  macroName_76.m_size = 10;
  macroName_76.m_start = "CHECK_THAT";
  capturedExpression_76.m_size = 0x34;
  capturedExpression_76.m_start = "4.710750e-5, WithinRel( data.fissionYields()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_76,(SourceLineInfo *)local_138,
             capturedExpression_76,ContinueOnFailure);
  local_100 = 4.71075e-05;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1a9;
  macroName_77.m_size = 10;
  macroName_77.m_start = "CHECK_THAT";
  capturedExpression_77.m_size = 0x2a;
  capturedExpression_77.m_start = "0, WithinRel( data.fissionYields()[2][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_77,(SourceLineInfo *)local_138,
             capturedExpression_77,ContinueOnFailure);
  local_100 = (double)((ulong)local_100 & 0xffffffff00000000);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  Catch::MatchExpr<int,_Catch::Matchers::WithinRelMatcher>::MatchExpr
            (&local_f8,(int *)&local_100,(WithinRelMatcher *)local_138);
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1aa;
  macroName_78.m_size = 10;
  macroName_78.m_start = "CHECK_THAT";
  capturedExpression_78.m_size = 0x2a;
  capturedExpression_78.m_start = "0, WithinRel( data.fissionYields()[2][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_78,(SourceLineInfo *)local_138,
             capturedExpression_78,ContinueOnFailure);
  local_100 = (double)((ulong)local_100 & 0xffffffff00000000);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  Catch::MatchExpr<int,_Catch::Matchers::WithinRelMatcher>::MatchExpr
            (&local_f8,(int *)&local_100,(WithinRelMatcher *)local_138);
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  njoy::ENDFtk::ListRecord::operator=
            (&data.super_ListRecord,
             &(chunk->data_).
              super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
              ._M_impl.super__Vector_impl_data._M_start[1].super_ListRecord);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1ad;
  macroName_79.m_size = 5;
  macroName_79.m_start = "CHECK";
  capturedExpression_79.m_size = 0xd;
  capturedExpression_79.m_start = "3 == data.I()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_79,(SourceLineInfo *)local_138,
             capturedExpression_79,ContinueOnFailure);
  local_130._1_1_ =
       (int)data.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
            _M_head_impl == 3;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4230;
  local_130._4_4_ = 3;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1ae;
  macroName_80.m_size = 5;
  macroName_80.m_start = "CHECK";
  capturedExpression_80.m_size = 0x1d;
  capturedExpression_80.m_start = "3 == data.interpolationType()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_80,(SourceLineInfo *)local_138,
             capturedExpression_80,ContinueOnFailure);
  local_130._1_1_ =
       (int)data.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
            _M_head_impl == 3;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4230;
  local_130._4_4_ = 3;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  local_118 = (int)data.super_ListRecord.metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>
                   ._M_head_impl;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1af;
  macroName_81.m_size = 5;
  macroName_81.m_start = "CHECK";
  capturedExpression_81.m_size = 0x12;
  capturedExpression_81.m_start = "false == data.LE()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_81,(SourceLineInfo *)local_138,
             capturedExpression_81,ContinueOnFailure);
  _Var3._M_p = local_130;
  local_130._0_2_ =
       CONCAT11((int)data.super_ListRecord.metadata.fields.
                     super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                     super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                     super__Tuple_impl<2UL,_long,_long,_long,_long>.
                     super__Head_base<2UL,_long,_false>._M_head_impl != 0,1);
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e42b0;
  local_130._3_5_ = SUB85(_Var3._M_p,3);
  local_130._0_3_ = (uint3)(ushort)local_130;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  local_118._0_1_ =
       (int)data.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
            _M_head_impl == 0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1b0;
  macroName_82.m_size = 5;
  macroName_82.m_start = "CHECK";
  capturedExpression_82.m_size = 0x23;
  capturedExpression_82.m_start = "false == data.isEnergyIndependent()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_82,(SourceLineInfo *)local_138,
             capturedExpression_82,ContinueOnFailure);
  _Var3._M_p = local_130;
  local_130._0_2_ =
       CONCAT11((int)data.super_ListRecord.metadata.fields.
                     super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                     super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                     super__Tuple_impl<2UL,_long,_long,_long,_long>.
                     super__Head_base<2UL,_long,_false>._M_head_impl != 0,1);
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e42b0;
  local_130._3_5_ = SUB85(_Var3._M_p,3);
  local_130._0_3_ = (uint3)(ushort)local_130;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  local_118._0_1_ =
       (int)data.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
            _M_head_impl == 0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1b1;
  macroName_83.m_size = 5;
  macroName_83.m_start = "CHECK";
  capturedExpression_83.m_size = 0xf;
  capturedExpression_83.m_start = "3 == data.NFP()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_83,(SourceLineInfo *)local_138,
             capturedExpression_83,ContinueOnFailure);
  local_130._1_1_ =
       (int)data.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
            super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
            super__Head_base<5UL,_long,_false>._M_head_impl == 3;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4230;
  local_130._4_4_ = 3;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1b2;
  macroName_84.m_size = 5;
  macroName_84.m_start = "CHECK";
  capturedExpression_84.m_size = 0x21;
  capturedExpression_84.m_start = "3 == data.numberFissionProducts()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_84,(SourceLineInfo *)local_138,
             capturedExpression_84,ContinueOnFailure);
  local_130._1_1_ =
       (int)data.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
            super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
            super__Head_base<5UL,_long,_false>._M_head_impl == 3;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4230;
  local_130._4_4_ = 3;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  local_118 = (int)data.super_ListRecord.metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.
                   super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                   super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1b3;
  macroName_85.m_size = 10;
  macroName_85.m_start = "CHECK_THAT";
  capturedExpression_85.m_size = 0x1d;
  capturedExpression_85.m_start = "500e+3, WithinRel( data.E() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_85,(SourceLineInfo *)local_138,
             capturedExpression_85,ContinueOnFailure);
  local_f8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x411e848000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             data.super_ListRecord.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bStack_cf = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_138,(double *)&local_f8);
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4270;
  local_c8._M_current = (double *)&local_f8;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_138;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1b4;
  macroName_86.m_size = 10;
  macroName_86.m_start = "CHECK_THAT";
  capturedExpression_86.m_size = 0x2a;
  capturedExpression_86.m_start = "500e+3, WithinRel( data.incidentEnergy() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_86,(SourceLineInfo *)local_138,
             capturedExpression_86,ContinueOnFailure);
  local_f8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x411e848000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             data.super_ListRecord.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bStack_cf = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_138,(double *)&local_f8);
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4270;
  local_c8._M_current = (double *)&local_f8;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_138;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1b6;
  macroName_87.m_size = 5;
  macroName_87.m_start = "CHECK";
  capturedExpression_87.m_size = 0x22;
  capturedExpression_87.m_start = "3 == data.fissionProducts().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_87,(SourceLineInfo *)local_138,
             capturedExpression_87,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  _local_118 = ranges::
               chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::
               size<concepts::detail::CPP_true_fn(concepts::detail::Nil)>();
  local_130._1_1_ = _local_118 == 3;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  local_130._4_4_ = 3;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1b7;
  macroName_88.m_size = 5;
  macroName_88.m_start = "CHECK";
  capturedExpression_88.m_size = 0x29;
  capturedExpression_88.m_start = "23066 == data.fissionProducts()[0].ZAFP()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_88,(SourceLineInfo *)local_138,
             capturedExpression_88,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  local_130._1_1_ = (int)(long)*(double *)local_f8.m_arg == 0x5a1a;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130._4_4_ = 0x5a1a;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  local_118 = (int)(long)*(double *)local_f8.m_arg;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1b8;
  macroName_89.m_size = 5;
  macroName_89.m_start = "CHECK";
  capturedExpression_89.m_size = 0x29;
  capturedExpression_89.m_start = "54135 == data.fissionProducts()[1].ZAFP()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_89,(SourceLineInfo *)local_138,
             capturedExpression_89,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  local_118 = (int)(long)*(double *)local_f8.m_arg;
  local_130._1_1_ = local_118 == 0xd377;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130._4_4_ = 0xd377;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1b9;
  macroName_90.m_size = 5;
  macroName_90.m_start = "CHECK";
  capturedExpression_90.m_size = 0x29;
  capturedExpression_90.m_start = "72171 == data.fissionProducts()[2].ZAFP()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_90,(SourceLineInfo *)local_138,
             capturedExpression_90,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  local_118 = (int)(long)*(double *)local_f8.m_arg;
  local_130._1_1_ = local_118 == 0x119eb;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130._4_4_ = 0x119eb;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1ba;
  macroName_91.m_size = 5;
  macroName_91.m_start = "CHECK";
  capturedExpression_91.m_size = 0x3d;
  capturedExpression_91.m_start = "23066 == data.fissionProducts()[0].fissionProductIdentifier()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_91,(SourceLineInfo *)local_138,
             capturedExpression_91,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  local_118 = (int)(long)*(double *)local_f8.m_arg;
  local_130._1_1_ = local_118 == 0x5a1a;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130._4_4_ = 0x5a1a;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1bb;
  macroName_92.m_size = 5;
  macroName_92.m_start = "CHECK";
  capturedExpression_92.m_size = 0x3d;
  capturedExpression_92.m_start = "54135 == data.fissionProducts()[1].fissionProductIdentifier()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_92,(SourceLineInfo *)local_138,
             capturedExpression_92,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  local_118 = (int)(long)*(double *)local_f8.m_arg;
  local_130._1_1_ = local_118 == 0xd377;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130._4_4_ = 0xd377;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1bc;
  macroName_93.m_size = 5;
  macroName_93.m_start = "CHECK";
  capturedExpression_93.m_size = 0x3d;
  capturedExpression_93.m_start = "72171 == data.fissionProducts()[2].fissionProductIdentifier()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_93,(SourceLineInfo *)local_138,
             capturedExpression_93,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  local_118 = (int)(long)*(double *)local_f8.m_arg;
  local_130._1_1_ = local_118 == 0x119eb;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130._4_4_ = 0x119eb;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1bd;
  macroName_94.m_size = 5;
  macroName_94.m_start = "CHECK";
  capturedExpression_94.m_size = 0x24;
  capturedExpression_94.m_start = "0 == data.fissionProducts()[0].FPS()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_94,(SourceLineInfo *)local_138,
             capturedExpression_94,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  local_118 = (int)(long)*(double *)((long)local_f8.m_arg + 8);
  local_130._1_1_ = local_118 == 0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1be;
  macroName_95.m_size = 5;
  macroName_95.m_start = "CHECK";
  capturedExpression_95.m_size = 0x24;
  capturedExpression_95.m_start = "0 == data.fissionProducts()[1].FPS()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_95,(SourceLineInfo *)local_138,
             capturedExpression_95,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  local_118 = (int)(long)*(double *)((long)local_f8.m_arg + 8);
  local_130._1_1_ = local_118 == 0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1bf;
  macroName_96.m_size = 5;
  macroName_96.m_start = "CHECK";
  capturedExpression_96.m_size = 0x24;
  capturedExpression_96.m_start = "0 == data.fissionProducts()[2].FPS()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_96,(SourceLineInfo *)local_138,
             capturedExpression_96,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  local_118 = (int)(long)*(double *)((long)local_f8.m_arg + 8);
  local_130._1_1_ = local_118 == 0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1c0;
  macroName_97.m_size = 5;
  macroName_97.m_start = "CHECK";
  capturedExpression_97.m_size = 0x2e;
  capturedExpression_97.m_start = "0 == data.fissionProducts()[0].isomericState()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_97,(SourceLineInfo *)local_138,
             capturedExpression_97,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  local_118 = (int)(long)*(double *)((long)local_f8.m_arg + 8);
  local_130._1_1_ = local_118 == 0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1c1;
  macroName_98.m_size = 5;
  macroName_98.m_start = "CHECK";
  capturedExpression_98.m_size = 0x2e;
  capturedExpression_98.m_start = "0 == data.fissionProducts()[1].isomericState()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_98,(SourceLineInfo *)local_138,
             capturedExpression_98,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  local_118 = (int)(long)*(double *)((long)local_f8.m_arg + 8);
  local_130._1_1_ = local_118 == 0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1c2;
  macroName_99.m_size = 5;
  macroName_99.m_start = "CHECK";
  capturedExpression_99.m_size = 0x2e;
  capturedExpression_99.m_start = "0 == data.fissionProducts()[2].isomericState()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_99,(SourceLineInfo *)local_138,
             capturedExpression_99,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  local_130._1_1_ = (int)(long)*(double *)((long)local_f8.m_arg + 8) == 0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  local_118 = (int)(long)*(double *)((long)local_f8.m_arg + 8);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1c3;
  macroName_x00100.m_size = 10;
  macroName_x00100.m_start = "CHECK_THAT";
  capturedExpression_x00100.m_size = 0x3a;
  capturedExpression_x00100.m_start = "4.48456e-18, WithinRel( data.fissionProducts()[0].Y()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00100,(SourceLineInfo *)local_138,
             capturedExpression_x00100,ContinueOnFailure);
  local_100 = 4.48456e-18;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_50,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 0x10));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1c4;
  macroName_x00101.m_size = 10;
  macroName_x00101.m_start = "CHECK_THAT";
  capturedExpression_x00101.m_size = 0x3a;
  capturedExpression_x00101.m_start = "2.87012e-18, WithinRel( data.fissionProducts()[0].Y()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00101,(SourceLineInfo *)local_138,
             capturedExpression_x00101,ContinueOnFailure);
  local_100 = 2.87012e-18;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_50,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 0x18));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1c5;
  macroName_x00102.m_size = 10;
  macroName_x00102.m_start = "CHECK_THAT";
  capturedExpression_x00102.m_size = 0x3a;
  capturedExpression_x00102.m_start = "1.196100e-3, WithinRel( data.fissionProducts()[1].Y()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00102,(SourceLineInfo *)local_138,
             capturedExpression_x00102,ContinueOnFailure);
  local_100 = 0.0011961;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_50,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 0x10));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1c6;
  macroName_x00103.m_size = 10;
  macroName_x00103.m_start = "CHECK_THAT";
  capturedExpression_x00103.m_size = 0x3a;
  capturedExpression_x00103.m_start = "2.751030e-4, WithinRel( data.fissionProducts()[1].Y()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00103,(SourceLineInfo *)local_138,
             capturedExpression_x00103,ContinueOnFailure);
  local_100 = 0.000275103;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_50,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 0x18));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1c7;
  macroName_x00104.m_size = 10;
  macroName_x00104.m_start = "CHECK_THAT";
  capturedExpression_x00104.m_size = 0x30;
  capturedExpression_x00104.m_start = "0, WithinRel( data.fissionProducts()[2].Y()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00104,(SourceLineInfo *)local_138,
             capturedExpression_x00104,ContinueOnFailure);
  local_100 = (double)((ulong)local_100 & 0xffffffff00000000);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_50,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 0x10));
  Catch::MatchExpr<int,_Catch::Matchers::WithinRelMatcher>::MatchExpr
            (&local_f8,(int *)&local_100,(WithinRelMatcher *)local_138);
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1c8;
  macroName_x00105.m_size = 10;
  macroName_x00105.m_start = "CHECK_THAT";
  capturedExpression_x00105.m_size = 0x30;
  capturedExpression_x00105.m_start = "0, WithinRel( data.fissionProducts()[2].Y()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00105,(SourceLineInfo *)local_138,
             capturedExpression_x00105,ContinueOnFailure);
  local_100 = (double)((ulong)local_100 & 0xffffffff00000000);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_50,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 0x18));
  Catch::MatchExpr<int,_Catch::Matchers::WithinRelMatcher>::MatchExpr
            (&local_f8,(int *)&local_100,(WithinRelMatcher *)local_138);
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1ca;
  macroName_x00106.m_size = 5;
  macroName_x00106.m_start = "CHECK";
  capturedExpression_x00106.m_size = 0x17;
  capturedExpression_x00106.m_start = "3 == data.ZAFP().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00106,(SourceLineInfo *)local_138,
             capturedExpression_x00106,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  _local_118 = (((CONCAT44(uStack_cc,CONCAT22(uStack_ce,CONCAT11(bStack_cf,local_d0))) -
                  (long)local_c8._M_current >> 3) + (long)local_c0._M_head_impl._M_current) - 1U) /
               (ulong)local_c0._M_head_impl._M_current;
  local_130._1_1_ = _local_118 == 3;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  local_130._4_4_ = 3;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1cb;
  macroName_x00107.m_size = 5;
  macroName_x00107.m_start = "CHECK";
  capturedExpression_x00107.m_size = 0x2c;
  capturedExpression_x00107.m_start = "3 == data.fissionProductIdentifiers().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00107,(SourceLineInfo *)local_138,
             capturedExpression_x00107,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  _local_118 = (((CONCAT44(uStack_cc,CONCAT22(uStack_ce,CONCAT11(bStack_cf,local_d0))) -
                  (long)local_c8._M_current >> 3) + (long)local_c0._M_head_impl._M_current) - 1U) /
               (ulong)local_c0._M_head_impl._M_current;
  local_130._1_1_ = _local_118 == 3;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  local_130._4_4_ = 3;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1cc;
  macroName_x00108.m_size = 5;
  macroName_x00108.m_start = "CHECK";
  capturedExpression_x00108.m_size = 0x16;
  capturedExpression_x00108.m_start = "3 == data.FPS().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00108,(SourceLineInfo *)local_138,
             capturedExpression_x00108,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  _local_118 = (((CONCAT44(uStack_cc,CONCAT22(uStack_ce,CONCAT11(bStack_cf,local_d0))) -
                  (long)local_c8._M_current >> 3) + (long)local_c0._M_head_impl._M_current) - 1U) /
               (ulong)local_c0._M_head_impl._M_current;
  local_130._1_1_ = _local_118 == 3;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  local_130._4_4_ = 3;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1cd;
  macroName_x00109.m_size = 5;
  macroName_x00109.m_start = "CHECK";
  capturedExpression_x00109.m_size = 0x21;
  capturedExpression_x00109.m_start = "3 == data.isomericStates().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00109,(SourceLineInfo *)local_138,
             capturedExpression_x00109,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  _local_118 = (((CONCAT44(uStack_cc,CONCAT22(uStack_ce,CONCAT11(bStack_cf,local_d0))) -
                  (long)local_c8._M_current >> 3) + (long)local_c0._M_head_impl._M_current) - 1U) /
               (ulong)local_c0._M_head_impl._M_current;
  local_130._1_1_ = _local_118 == 3;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  local_130._4_4_ = 3;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1ce;
  macroName_x00110.m_size = 5;
  macroName_x00110.m_start = "CHECK";
  capturedExpression_x00110.m_size = 0x14;
  capturedExpression_x00110.m_start = "3 == data.Y().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00110,(SourceLineInfo *)local_138,
             capturedExpression_x00110,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  local_b8 = (WithinRelMatcher *)
             ranges::
             stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
             ::size<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
                       ((stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
                         *)local_138);
  bStack_cf = local_b8 == (WithinRelMatcher *)0x3;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 3;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1cf;
  macroName_x00111.m_size = 5;
  macroName_x00111.m_start = "CHECK";
  capturedExpression_x00111.m_size = 0x20;
  capturedExpression_x00111.m_start = "3 == data.fissionYields().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00111,(SourceLineInfo *)local_138,
             capturedExpression_x00111,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  local_b8 = (WithinRelMatcher *)
             ranges::
             stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
             ::size<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
                       ((stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
                         *)local_138);
  bStack_cf = local_b8 == (WithinRelMatcher *)0x3;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 3;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1d0;
  macroName_x00112.m_size = 5;
  macroName_x00112.m_start = "CHECK";
  capturedExpression_x00112.m_size = 0x17;
  capturedExpression_x00112.m_start = "23066 == data.ZAFP()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00112,(SourceLineInfo *)local_138,
             capturedExpression_x00112,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,0);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 23066.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130._4_4_ = 0x5a1a;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1d1;
  macroName_x00113.m_size = 5;
  macroName_x00113.m_start = "CHECK";
  capturedExpression_x00113.m_size = 0x17;
  capturedExpression_x00113.m_start = "54135 == data.ZAFP()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00113,(SourceLineInfo *)local_138,
             capturedExpression_x00113,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,1);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 54135.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130._4_4_ = 0xd377;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1d2;
  macroName_x00114.m_size = 5;
  macroName_x00114.m_start = "CHECK";
  capturedExpression_x00114.m_size = 0x17;
  capturedExpression_x00114.m_start = "72171 == data.ZAFP()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00114,(SourceLineInfo *)local_138,
             capturedExpression_x00114,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,2);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 72171.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130._4_4_ = 0x119eb;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1d3;
  macroName_x00115.m_size = 5;
  macroName_x00115.m_start = "CHECK";
  capturedExpression_x00115.m_size = 0x2c;
  capturedExpression_x00115.m_start = "23066 == data.fissionProductIdentifiers()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00115,(SourceLineInfo *)local_138,
             capturedExpression_x00115,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,0);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 23066.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130._4_4_ = 0x5a1a;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1d4;
  macroName_x00116.m_size = 5;
  macroName_x00116.m_start = "CHECK";
  capturedExpression_x00116.m_size = 0x2c;
  capturedExpression_x00116.m_start = "54135 == data.fissionProductIdentifiers()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00116,(SourceLineInfo *)local_138,
             capturedExpression_x00116,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,1);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 54135.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130._4_4_ = 0xd377;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1d5;
  macroName_x00117.m_size = 5;
  macroName_x00117.m_start = "CHECK";
  capturedExpression_x00117.m_size = 0x2c;
  capturedExpression_x00117.m_start = "72171 == data.fissionProductIdentifiers()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00117,(SourceLineInfo *)local_138,
             capturedExpression_x00117,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,2);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 72171.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130._4_4_ = 0x119eb;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1d6;
  macroName_x00118.m_size = 5;
  macroName_x00118.m_start = "CHECK";
  capturedExpression_x00118.m_size = 0x12;
  capturedExpression_x00118.m_start = "0 == data.FPS()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00118,(SourceLineInfo *)local_138,
             capturedExpression_x00118,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,0);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 0.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1d7;
  macroName_x00119.m_size = 5;
  macroName_x00119.m_start = "CHECK";
  capturedExpression_x00119.m_size = 0x12;
  capturedExpression_x00119.m_start = "0 == data.FPS()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00119,(SourceLineInfo *)local_138,
             capturedExpression_x00119,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,1);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 0.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1d8;
  macroName_x00120.m_size = 5;
  macroName_x00120.m_start = "CHECK";
  capturedExpression_x00120.m_size = 0x12;
  capturedExpression_x00120.m_start = "0 == data.FPS()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00120,(SourceLineInfo *)local_138,
             capturedExpression_x00120,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,2);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 0.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1d9;
  macroName_x00121.m_size = 5;
  macroName_x00121.m_start = "CHECK";
  capturedExpression_x00121.m_size = 0x1d;
  capturedExpression_x00121.m_start = "0 == data.isomericStates()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00121,(SourceLineInfo *)local_138,
             capturedExpression_x00121,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,0);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 0.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1da;
  macroName_x00122.m_size = 5;
  macroName_x00122.m_start = "CHECK";
  capturedExpression_x00122.m_size = 0x1d;
  capturedExpression_x00122.m_start = "0 == data.isomericStates()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00122,(SourceLineInfo *)local_138,
             capturedExpression_x00122,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,1);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 0.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1db;
  macroName_x00123.m_size = 5;
  macroName_x00123.m_start = "CHECK";
  capturedExpression_x00123.m_size = 0x1d;
  capturedExpression_x00123.m_start = "0 == data.isomericStates()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00123,(SourceLineInfo *)local_138,
             capturedExpression_x00123,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,2);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 0.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1dc;
  macroName_x00124.m_size = 5;
  macroName_x00124.m_start = "CHECK";
  capturedExpression_x00124.m_size = 0x17;
  capturedExpression_x00124.m_start = "2 == data.Y()[0].size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00124,(SourceLineInfo *)local_138,
             capturedExpression_x00124,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_> *)&local_f8,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_138,0);
  local_b8 = (WithinRelMatcher *)
             (CONCAT62(local_f8.super_ITransientExpression._10_6_,
                       CONCAT11(local_f8.super_ITransientExpression.m_result,
                                local_f8.super_ITransientExpression.m_isBinaryExpression)) -
              (long)local_f8.m_arg >> 3);
  if (local_f8.m_matcher < local_b8) {
    local_b8 = local_f8.m_matcher;
  }
  bStack_cf = local_b8 == (WithinRelMatcher *)0x2;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 2;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1dd;
  macroName_x00125.m_size = 5;
  macroName_x00125.m_start = "CHECK";
  capturedExpression_x00125.m_size = 0x17;
  capturedExpression_x00125.m_start = "2 == data.Y()[1].size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00125,(SourceLineInfo *)local_138,
             capturedExpression_x00125,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_> *)&local_f8,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_138,1);
  local_b8 = (WithinRelMatcher *)
             (CONCAT62(local_f8.super_ITransientExpression._10_6_,
                       CONCAT11(local_f8.super_ITransientExpression.m_result,
                                local_f8.super_ITransientExpression.m_isBinaryExpression)) -
              (long)local_f8.m_arg >> 3);
  if (local_f8.m_matcher < local_b8) {
    local_b8 = local_f8.m_matcher;
  }
  bStack_cf = local_b8 == (WithinRelMatcher *)0x2;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 2;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1de;
  macroName_x00126.m_size = 5;
  macroName_x00126.m_start = "CHECK";
  capturedExpression_x00126.m_size = 0x17;
  capturedExpression_x00126.m_start = "2 == data.Y()[2].size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00126,(SourceLineInfo *)local_138,
             capturedExpression_x00126,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_> *)&local_f8,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_138,2);
  local_b8 = (WithinRelMatcher *)
             (CONCAT62(local_f8.super_ITransientExpression._10_6_,
                       CONCAT11(local_f8.super_ITransientExpression.m_result,
                                local_f8.super_ITransientExpression.m_isBinaryExpression)) -
              (long)local_f8.m_arg >> 3);
  if (local_f8.m_matcher < local_b8) {
    local_b8 = local_f8.m_matcher;
  }
  bStack_cf = local_b8 == (WithinRelMatcher *)0x2;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 2;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1df;
  macroName_x00127.m_size = 5;
  macroName_x00127.m_start = "CHECK";
  capturedExpression_x00127.m_size = 0x23;
  capturedExpression_x00127.m_start = "2 == data.fissionYields()[0].size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00127,(SourceLineInfo *)local_138,
             capturedExpression_x00127,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_> *)&local_f8,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_138,0);
  local_b8 = (WithinRelMatcher *)
             (CONCAT62(local_f8.super_ITransientExpression._10_6_,
                       CONCAT11(local_f8.super_ITransientExpression.m_result,
                                local_f8.super_ITransientExpression.m_isBinaryExpression)) -
              (long)local_f8.m_arg >> 3);
  if (local_f8.m_matcher < local_b8) {
    local_b8 = local_f8.m_matcher;
  }
  bStack_cf = local_b8 == (WithinRelMatcher *)0x2;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 2;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1e0;
  macroName_x00128.m_size = 5;
  macroName_x00128.m_start = "CHECK";
  capturedExpression_x00128.m_size = 0x23;
  capturedExpression_x00128.m_start = "2 == data.fissionYields()[1].size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00128,(SourceLineInfo *)local_138,
             capturedExpression_x00128,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_> *)&local_f8,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_138,1);
  local_b8 = (WithinRelMatcher *)
             (CONCAT62(local_f8.super_ITransientExpression._10_6_,
                       CONCAT11(local_f8.super_ITransientExpression.m_result,
                                local_f8.super_ITransientExpression.m_isBinaryExpression)) -
              (long)local_f8.m_arg >> 3);
  if (local_f8.m_matcher < local_b8) {
    local_b8 = local_f8.m_matcher;
  }
  bStack_cf = local_b8 == (WithinRelMatcher *)0x2;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 2;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1e1;
  macroName_x00129.m_size = 5;
  macroName_x00129.m_start = "CHECK";
  capturedExpression_x00129.m_size = 0x23;
  capturedExpression_x00129.m_start = "2 == data.fissionYields()[2].size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00129,(SourceLineInfo *)local_138,
             capturedExpression_x00129,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_> *)&local_f8,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_138,2);
  local_b8 = (WithinRelMatcher *)
             (CONCAT62(local_f8.super_ITransientExpression._10_6_,
                       CONCAT11(local_f8.super_ITransientExpression.m_result,
                                local_f8.super_ITransientExpression.m_isBinaryExpression)) -
              (long)local_f8.m_arg >> 3);
  if (local_f8.m_matcher < local_b8) {
    local_b8 = local_f8.m_matcher;
  }
  bStack_cf = local_b8 == (WithinRelMatcher *)0x2;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 2;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1e2;
  macroName_x00130.m_size = 10;
  macroName_x00130.m_start = "CHECK_THAT";
  capturedExpression_x00130.m_size = 0x28;
  capturedExpression_x00130.m_start = "4.48456e-18, WithinRel( data.Y()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00130,(SourceLineInfo *)local_138,
             capturedExpression_x00130,ContinueOnFailure);
  local_100 = 4.48456e-18;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1e3;
  macroName_x00131.m_size = 10;
  macroName_x00131.m_start = "CHECK_THAT";
  capturedExpression_x00131.m_size = 0x28;
  capturedExpression_x00131.m_start = "2.87012e-18, WithinRel( data.Y()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00131,(SourceLineInfo *)local_138,
             capturedExpression_x00131,ContinueOnFailure);
  local_100 = 2.87012e-18;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1e4;
  macroName_x00132.m_size = 10;
  macroName_x00132.m_start = "CHECK_THAT";
  capturedExpression_x00132.m_size = 0x28;
  capturedExpression_x00132.m_start = "1.196100e-3, WithinRel( data.Y()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00132,(SourceLineInfo *)local_138,
             capturedExpression_x00132,ContinueOnFailure);
  local_100 = 0.0011961;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1e5;
  macroName_x00133.m_size = 10;
  macroName_x00133.m_start = "CHECK_THAT";
  capturedExpression_x00133.m_size = 0x28;
  capturedExpression_x00133.m_start = "2.751030e-4, WithinRel( data.Y()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00133,(SourceLineInfo *)local_138,
             capturedExpression_x00133,ContinueOnFailure);
  local_100 = 0.000275103;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1e6;
  macroName_x00134.m_size = 10;
  macroName_x00134.m_start = "CHECK_THAT";
  capturedExpression_x00134.m_size = 0x1e;
  capturedExpression_x00134.m_start = "0, WithinRel( data.Y()[2][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00134,(SourceLineInfo *)local_138,
             capturedExpression_x00134,ContinueOnFailure);
  local_100 = (double)((ulong)local_100 & 0xffffffff00000000);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  Catch::MatchExpr<int,_Catch::Matchers::WithinRelMatcher>::MatchExpr
            (&local_f8,(int *)&local_100,(WithinRelMatcher *)local_138);
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1e7;
  macroName_x00135.m_size = 10;
  macroName_x00135.m_start = "CHECK_THAT";
  capturedExpression_x00135.m_size = 0x1e;
  capturedExpression_x00135.m_start = "0, WithinRel( data.Y()[2][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00135,(SourceLineInfo *)local_138,
             capturedExpression_x00135,ContinueOnFailure);
  local_100 = (double)((ulong)local_100 & 0xffffffff00000000);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  Catch::MatchExpr<int,_Catch::Matchers::WithinRelMatcher>::MatchExpr
            (&local_f8,(int *)&local_100,(WithinRelMatcher *)local_138);
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1e8;
  macroName_x00136.m_size = 10;
  macroName_x00136.m_start = "CHECK_THAT";
  capturedExpression_x00136.m_size = 0x34;
  capturedExpression_x00136.m_start = "4.48456e-18, WithinRel( data.fissionYields()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00136,(SourceLineInfo *)local_138,
             capturedExpression_x00136,ContinueOnFailure);
  local_100 = 4.48456e-18;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1e9;
  macroName_x00137.m_size = 10;
  macroName_x00137.m_start = "CHECK_THAT";
  capturedExpression_x00137.m_size = 0x34;
  capturedExpression_x00137.m_start = "2.87012e-18, WithinRel( data.fissionYields()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00137,(SourceLineInfo *)local_138,
             capturedExpression_x00137,ContinueOnFailure);
  local_100 = 2.87012e-18;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1ea;
  macroName_x00138.m_size = 10;
  macroName_x00138.m_start = "CHECK_THAT";
  capturedExpression_x00138.m_size = 0x34;
  capturedExpression_x00138.m_start = "1.196100e-3, WithinRel( data.fissionYields()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00138,(SourceLineInfo *)local_138,
             capturedExpression_x00138,ContinueOnFailure);
  local_100 = 0.0011961;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1eb;
  macroName_x00139.m_size = 10;
  macroName_x00139.m_start = "CHECK_THAT";
  capturedExpression_x00139.m_size = 0x34;
  capturedExpression_x00139.m_start = "2.751030e-4, WithinRel( data.fissionYields()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00139,(SourceLineInfo *)local_138,
             capturedExpression_x00139,ContinueOnFailure);
  local_100 = 0.000275103;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1ec;
  macroName_x00140.m_size = 10;
  macroName_x00140.m_start = "CHECK_THAT";
  capturedExpression_x00140.m_size = 0x2a;
  capturedExpression_x00140.m_start = "0, WithinRel( data.fissionYields()[2][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00140,(SourceLineInfo *)local_138,
             capturedExpression_x00140,ContinueOnFailure);
  local_100 = (double)((ulong)local_100 & 0xffffffff00000000);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  Catch::MatchExpr<int,_Catch::Matchers::WithinRelMatcher>::MatchExpr
            (&local_f8,(int *)&local_100,(WithinRelMatcher *)local_138);
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1ed;
  macroName_x00141.m_size = 10;
  macroName_x00141.m_start = "CHECK_THAT";
  capturedExpression_x00141.m_size = 0x2a;
  capturedExpression_x00141.m_start = "0, WithinRel( data.fissionYields()[2][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00141,(SourceLineInfo *)local_138,
             capturedExpression_x00141,ContinueOnFailure);
  local_100 = (double)((ulong)local_100 & 0xffffffff00000000);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  Catch::MatchExpr<int,_Catch::Matchers::WithinRelMatcher>::MatchExpr
            (&local_f8,(int *)&local_100,(WithinRelMatcher *)local_138);
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_17,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x1ef;
  macroName_x00142.m_size = 5;
  macroName_x00142.m_start = "CHECK";
  capturedExpression_x00142.m_size = 0xf;
  capturedExpression_x00142.m_start = "7 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_17,macroName_x00142,(SourceLineInfo *)local_138,
             capturedExpression_x00142,ContinueOnFailure);
  _local_118 = njoy::ENDFtk::section::Type<8,_454>::NC(chunk);
  local_130._1_1_ = _local_118 == 7;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e42f0;
  local_130._4_4_ = 7;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_17,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_17);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_17);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&this->super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void verifyChunk( const section::Type< 8, 454 >& chunk ) {

  CHECK( 454 == chunk.MT() );
  CHECK( 454 == chunk.sectionNumber() );

  CHECK( 92235 == chunk.ZA() );
  CHECK( 92235 == chunk.targetIdentifier() );
  CHECK_THAT( 233.0250, WithinRel( chunk.AWR() ) );
  CHECK_THAT( 233.0250, WithinRel( chunk.atomicWeightRatio() ) );

  CHECK( false == chunk.LE() );
  CHECK( false == chunk.isEnergyIndependent() );

  CHECK( 2 == chunk.NE() );
  CHECK( 2 == chunk.numberIncidentEnergies() );
  CHECK( 2 == chunk.E().size() );
  CHECK( 2 == chunk.incidentEnergies().size() );
  CHECK_THAT( 0.0253, WithinRel( chunk.E()[0] ) );
  CHECK_THAT( 500e+3, WithinRel( chunk.E()[1] ) );
  CHECK_THAT( 0.0253, WithinRel( chunk.incidentEnergies()[0] ) );
  CHECK_THAT( 500e+3, WithinRel( chunk.incidentEnergies()[1] ) );

  CHECK( 2 == chunk.yields().size() );

  auto data = chunk.yields()[0];
  CHECK( 1 == data.I() );
  CHECK( 1 == data.interpolationType() );
  CHECK( false == data.LE() );
  CHECK( false == data.isEnergyIndependent() );
  CHECK( 3 == data.NFP() );
  CHECK( 3 == data.numberFissionProducts() );
  CHECK_THAT( 0.0253, WithinRel( data.E() ) );
  CHECK_THAT( 0.0253, WithinRel( data.incidentEnergy() ) );

  CHECK( 3 == data.fissionProducts().size() );
  CHECK( 23066 == data.fissionProducts()[0].ZAFP() );
  CHECK( 54135 == data.fissionProducts()[1].ZAFP() );
  CHECK( 72171 == data.fissionProducts()[2].ZAFP() );
  CHECK( 23066 == data.fissionProducts()[0].fissionProductIdentifier() );
  CHECK( 54135 == data.fissionProducts()[1].fissionProductIdentifier() );
  CHECK( 72171 == data.fissionProducts()[2].fissionProductIdentifier() );
  CHECK( 0 == data.fissionProducts()[0].FPS() );
  CHECK( 0 == data.fissionProducts()[1].FPS() );
  CHECK( 0 == data.fissionProducts()[2].FPS() );
  CHECK( 0 == data.fissionProducts()[0].isomericState() );
  CHECK( 0 == data.fissionProducts()[1].isomericState() );
  CHECK( 0 == data.fissionProducts()[2].isomericState() );
  CHECK_THAT( 2.05032e-19, WithinRel( data.fissionProducts()[0].Y()[0] ) );
  CHECK_THAT( 1.31220e-19, WithinRel( data.fissionProducts()[0].Y()[1] ) );
  CHECK_THAT( 7.851250e-4, WithinRel( data.fissionProducts()[1].Y()[0] ) );
  CHECK_THAT( 4.710750e-5, WithinRel( data.fissionProducts()[1].Y()[1] ) );
  CHECK_THAT( 0, WithinRel( data.fissionProducts()[2].Y()[0] ) );
  CHECK_THAT( 0, WithinRel( data.fissionProducts()[2].Y()[1] ) );

  CHECK( 3 == data.ZAFP().size() );
  CHECK( 3 == data.fissionProductIdentifiers().size() );
  CHECK( 3 == data.FPS().size() );
  CHECK( 3 == data.isomericStates().size() );
  CHECK( 3 == data.Y().size() );
  CHECK( 3 == data.fissionYields().size() );
  CHECK( 23066 == data.ZAFP()[0] );
  CHECK( 54135 == data.ZAFP()[1] );
  CHECK( 72171 == data.ZAFP()[2] );
  CHECK( 23066 == data.fissionProductIdentifiers()[0] );
  CHECK( 54135 == data.fissionProductIdentifiers()[1] );
  CHECK( 72171 == data.fissionProductIdentifiers()[2] );
  CHECK( 0 == data.FPS()[0] );
  CHECK( 0 == data.FPS()[1] );
  CHECK( 0 == data.FPS()[2] );
  CHECK( 0 == data.isomericStates()[0] );
  CHECK( 0 == data.isomericStates()[1] );
  CHECK( 0 == data.isomericStates()[2] );
  CHECK( 2 == data.Y()[0].size() );
  CHECK( 2 == data.Y()[1].size() );
  CHECK( 2 == data.Y()[2].size() );
  CHECK( 2 == data.fissionYields()[0].size() );
  CHECK( 2 == data.fissionYields()[1].size() );
  CHECK( 2 == data.fissionYields()[2].size() );
  CHECK_THAT( 2.05032e-19, WithinRel( data.Y()[0][0] ) );
  CHECK_THAT( 1.31220e-19, WithinRel( data.Y()[0][1] ) );
  CHECK_THAT( 7.851250e-4, WithinRel( data.Y()[1][0] ) );
  CHECK_THAT( 4.710750e-5, WithinRel( data.Y()[1][1] ) );
  CHECK_THAT( 0, WithinRel( data.Y()[2][0] ) );
  CHECK_THAT( 0, WithinRel( data.Y()[2][1] ) );
  CHECK_THAT( 2.05032e-19, WithinRel( data.fissionYields()[0][0] ) );
  CHECK_THAT( 1.31220e-19, WithinRel( data.fissionYields()[0][1] ) );
  CHECK_THAT( 7.851250e-4, WithinRel( data.fissionYields()[1][0] ) );
  CHECK_THAT( 4.710750e-5, WithinRel( data.fissionYields()[1][1] ) );
  CHECK_THAT( 0, WithinRel( data.fissionYields()[2][0] ) );
  CHECK_THAT( 0, WithinRel( data.fissionYields()[2][1] ) );

  data = chunk.yields()[1];
  CHECK( 3 == data.I() );
  CHECK( 3 == data.interpolationType() );
  CHECK( false == data.LE() );
  CHECK( false == data.isEnergyIndependent() );
  CHECK( 3 == data.NFP() );
  CHECK( 3 == data.numberFissionProducts() );
  CHECK_THAT( 500e+3, WithinRel( data.E() ) );
  CHECK_THAT( 500e+3, WithinRel( data.incidentEnergy() ) );

  CHECK( 3 == data.fissionProducts().size() );
  CHECK( 23066 == data.fissionProducts()[0].ZAFP() );
  CHECK( 54135 == data.fissionProducts()[1].ZAFP() );
  CHECK( 72171 == data.fissionProducts()[2].ZAFP() );
  CHECK( 23066 == data.fissionProducts()[0].fissionProductIdentifier() );
  CHECK( 54135 == data.fissionProducts()[1].fissionProductIdentifier() );
  CHECK( 72171 == data.fissionProducts()[2].fissionProductIdentifier() );
  CHECK( 0 == data.fissionProducts()[0].FPS() );
  CHECK( 0 == data.fissionProducts()[1].FPS() );
  CHECK( 0 == data.fissionProducts()[2].FPS() );
  CHECK( 0 == data.fissionProducts()[0].isomericState() );
  CHECK( 0 == data.fissionProducts()[1].isomericState() );
  CHECK( 0 == data.fissionProducts()[2].isomericState() );
  CHECK_THAT( 4.48456e-18, WithinRel( data.fissionProducts()[0].Y()[0] ) );
  CHECK_THAT( 2.87012e-18, WithinRel( data.fissionProducts()[0].Y()[1] ) );
  CHECK_THAT( 1.196100e-3, WithinRel( data.fissionProducts()[1].Y()[0] ) );
  CHECK_THAT( 2.751030e-4, WithinRel( data.fissionProducts()[1].Y()[1] ) );
  CHECK_THAT( 0, WithinRel( data.fissionProducts()[2].Y()[0] ) );
  CHECK_THAT( 0, WithinRel( data.fissionProducts()[2].Y()[1] ) );

  CHECK( 3 == data.ZAFP().size() );
  CHECK( 3 == data.fissionProductIdentifiers().size() );
  CHECK( 3 == data.FPS().size() );
  CHECK( 3 == data.isomericStates().size() );
  CHECK( 3 == data.Y().size() );
  CHECK( 3 == data.fissionYields().size() );
  CHECK( 23066 == data.ZAFP()[0] );
  CHECK( 54135 == data.ZAFP()[1] );
  CHECK( 72171 == data.ZAFP()[2] );
  CHECK( 23066 == data.fissionProductIdentifiers()[0] );
  CHECK( 54135 == data.fissionProductIdentifiers()[1] );
  CHECK( 72171 == data.fissionProductIdentifiers()[2] );
  CHECK( 0 == data.FPS()[0] );
  CHECK( 0 == data.FPS()[1] );
  CHECK( 0 == data.FPS()[2] );
  CHECK( 0 == data.isomericStates()[0] );
  CHECK( 0 == data.isomericStates()[1] );
  CHECK( 0 == data.isomericStates()[2] );
  CHECK( 2 == data.Y()[0].size() );
  CHECK( 2 == data.Y()[1].size() );
  CHECK( 2 == data.Y()[2].size() );
  CHECK( 2 == data.fissionYields()[0].size() );
  CHECK( 2 == data.fissionYields()[1].size() );
  CHECK( 2 == data.fissionYields()[2].size() );
  CHECK_THAT( 4.48456e-18, WithinRel( data.Y()[0][0] ) );
  CHECK_THAT( 2.87012e-18, WithinRel( data.Y()[0][1] ) );
  CHECK_THAT( 1.196100e-3, WithinRel( data.Y()[1][0] ) );
  CHECK_THAT( 2.751030e-4, WithinRel( data.Y()[1][1] ) );
  CHECK_THAT( 0, WithinRel( data.Y()[2][0] ) );
  CHECK_THAT( 0, WithinRel( data.Y()[2][1] ) );
  CHECK_THAT( 4.48456e-18, WithinRel( data.fissionYields()[0][0] ) );
  CHECK_THAT( 2.87012e-18, WithinRel( data.fissionYields()[0][1] ) );
  CHECK_THAT( 1.196100e-3, WithinRel( data.fissionYields()[1][0] ) );
  CHECK_THAT( 2.751030e-4, WithinRel( data.fissionYields()[1][1] ) );
  CHECK_THAT( 0, WithinRel( data.fissionYields()[2][0] ) );
  CHECK_THAT( 0, WithinRel( data.fissionYields()[2][1] ) );

  CHECK( 7 == chunk.NC() );
}